

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O1

void borg_parse(char *msg)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  if ((msg != (char *)0x0) && (*borg_cfg != 0)) {
    pcVar2 = format("# Parsing msg <%s>",msg);
    borg_note(pcVar2);
  }
  if ((borg_parse::len != L'\0') && ((msg == (char *)0x0 || (*msg != ' ')))) {
    iVar1 = 0;
    if (L'\x01' < borg_parse::len) {
      lVar6 = 0;
      lVar5 = 2;
      iVar1 = 0;
      do {
        if ((((ulong)(byte)borg_parse::buf[lVar6] < 0x40) &&
            ((0x8000400600000000U >> ((ulong)(byte)borg_parse::buf[lVar6] & 0x3f) & 1) != 0)) &&
           (borg_parse::buf[lVar6 + 1] == ' ')) {
          borg_parse::buf[lVar6 + 1] = '\0';
          borg_parse_aux(borg_parse::buf + iVar1,((int)lVar6 + 1) - iVar1);
          borg_parse::buf[lVar6 + 1] = ' ';
          lVar3 = lVar5;
          do {
            pcVar2 = borg_parse::buf + lVar3;
            lVar3 = lVar3 + 1;
          } while (*pcVar2 == ' ');
          iVar1 = (int)lVar3 + -1;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar6 < (long)borg_parse::len + -1);
    }
    borg_parse_aux(borg_parse::buf + iVar1,borg_parse::len - iVar1);
    borg_parse::len = L'\0';
  }
  if (msg == (char *)0x0) {
    borg_parse::len = L'\0';
  }
  else if (*msg == ' ') {
    sVar4 = strnfmt(borg_parse::buf + borg_parse::len,0x400 - (long)borg_parse::len,"%s",msg);
    borg_parse::len = (int)sVar4 + borg_parse::len;
  }
  else {
    sVar4 = strnfmt(borg_parse::buf,0x400,"%s",msg);
    borg_parse::len = (wchar_t)sVar4;
  }
  return;
}

Assistant:

void borg_parse(char *msg)
{
    static int  len = 0;
    static char buf[1024];

    /* Note the long message */
    if (borg_cfg[BORG_VERBOSE] && msg)
        borg_note(format("# Parsing msg <%s>", msg));

    /* Flush messages */
    if (len && (!msg || (msg[0] != ' '))) {
        int i, j;

        /* Split out punctuation */
        for (j = i = 0; i < len - 1; i++) {
            /* Check for punctuation */
            if ((buf[i] == '.') || (buf[i] == '!') || (buf[i] == '?')
                || (buf[i] == '"')) {
                /* Require space */
                if (buf[i + 1] == ' ') {
                    /* Terminate */
                    buf[i + 1] = '\0';

                    /* Parse fragment */
                    borg_parse_aux(buf + j, (i + 1) - j);

                    /* Restore */
                    buf[i + 1] = ' ';

                    /* Advance past spaces */
                    for (j = i + 2; buf[j] == ' '; j++) /* loop */
                        ;
                }
            }
        }

        /* Parse tail */
        borg_parse_aux(buf + j, len - j);

        /* Forget */
        len = 0;
    }

    /* No message */
    if (!msg) {
        /* Start over */
        len = 0;
    }

    /* Continued message */
    else if (msg[0] == ' ') {
        /* Collect, verify, and grow */
        len += strnfmt(buf + len, 1024 - len, "%s", msg);
    }

    /* New message */
    else {
        /* Collect, verify, and grow */
        len = strnfmt(buf, 1024, "%s", msg);
    }
}